

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mesh * rf_gen_mesh_heightmap
                    (rf_mesh *__return_storage_ptr__,rf_image heightmap,rf_vec3 size,
                    rf_allocator allocator,rf_allocator temp_allocator)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_source_location rVar4;
  rf_allocator_args rVar5;
  rf_allocator allocator_00;
  undefined1 auVar6 [24];
  undefined1 auVar7 [24];
  undefined1 auVar8 [24];
  uint *puVar9;
  rf_color *prVar10;
  float *pfVar11;
  rf_allocator_proc *prVar12;
  float fVar13;
  rf_mesh *mesh;
  long local_150;
  rf_int i;
  rf_int x;
  rf_int z;
  rf_vec3 scale_factor;
  int tris_counter;
  int n_counter;
  int vertex_texcoord_counter;
  int vertex_pos_counter;
  uint uStack_104;
  uint uStack_d4;
  uint uStack_a4;
  rf_color *pixels;
  int map_z;
  int map_x;
  uint uStack_64;
  void *local_48;
  rf_allocator temp_allocator_local;
  rf_allocator allocator_local;
  float local_14;
  float fStack_10;
  rf_vec3 size_local;
  
  prVar12 = allocator.allocator_proc;
  temp_allocator_local.allocator_proc = (rf_allocator_proc *)allocator.user_data;
  temp_allocator_local.user_data = temp_allocator.allocator_proc;
  local_48 = temp_allocator.user_data;
  memset(__return_storage_ptr__,0,0x70);
  rVar1.proc_name = "rf_gen_mesh_heightmap";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x891d;
  rVar5._16_8_ = (ulong)uStack_64 << 0x20;
  rVar5.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar5.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar9 = (uint *)(*prVar12)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar1,RF_AM_ALLOC
                              ,rVar5);
  __return_storage_ptr__->vbo_id = puVar9;
  memset(__return_storage_ptr__->vbo_id,0,0x1c);
  allocator_00.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
  allocator_00.user_data = local_48;
  prVar10 = rf_image_pixels_to_rgba32(heightmap,allocator_00);
  __return_storage_ptr__->triangle_count = (heightmap.width + -1) * (heightmap.height + -1) * 2;
  __return_storage_ptr__->vertex_count = __return_storage_ptr__->triangle_count * 3;
  rVar2.proc_name = "rf_gen_mesh_heightmap";
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.line_in_file = 0x892a;
  auVar6._8_8_ = (ulong)uStack_a4 << 0x20;
  auVar6._0_8_ = (long)(__return_storage_ptr__->vertex_count * 3) << 2;
  auVar6._16_8_ = 0;
  pfVar11 = (float *)(*prVar12)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar2,
                                RF_AM_ALLOC,(rf_allocator_args)(auVar6 << 0x40));
  __return_storage_ptr__->vertices = pfVar11;
  rVar3.proc_name = "rf_gen_mesh_heightmap";
  rVar3.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar3.line_in_file = 0x892b;
  auVar7._8_8_ = (ulong)uStack_d4 << 0x20;
  auVar7._0_8_ = (long)(__return_storage_ptr__->vertex_count * 3) << 2;
  auVar7._16_8_ = 0;
  pfVar11 = (float *)(*prVar12)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar3,
                                RF_AM_ALLOC,(rf_allocator_args)(auVar7 << 0x40));
  __return_storage_ptr__->normals = pfVar11;
  rVar4.proc_name = "rf_gen_mesh_heightmap";
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.line_in_file = 0x892c;
  auVar8._8_8_ = (ulong)uStack_104 << 0x20;
  auVar8._0_8_ = (long)(__return_storage_ptr__->vertex_count << 1) << 2;
  auVar8._16_8_ = 0;
  pfVar11 = (float *)(*prVar12)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar4,
                                RF_AM_ALLOC,(rf_allocator_args)(auVar8 << 0x40));
  __return_storage_ptr__->texcoords = pfVar11;
  __return_storage_ptr__->colors = (uchar *)0x0;
  n_counter = 0;
  tris_counter = 0;
  scale_factor.z = 0.0;
  local_14 = size.x;
  local_14 = local_14 / (float)heightmap.width;
  fStack_10 = size.y;
  fStack_10 = fStack_10 / 255.0;
  fVar13 = size.z / (float)heightmap.height;
  for (x = 0; x < heightmap.height + -1; x = x + 1) {
    for (i = 0; i < heightmap.width + -1; i = i + 1) {
      __return_storage_ptr__->vertices[n_counter] = (float)i * local_14;
      __return_storage_ptr__->vertices[n_counter + 1] =
           (float)(((uint)prVar10[i + x * heightmap.width].r +
                    (uint)prVar10[i + x * heightmap.width].g +
                   (uint)prVar10[i + x * heightmap.width].b) / 3) * fStack_10;
      __return_storage_ptr__->vertices[n_counter + 2] = (float)x * fVar13;
      __return_storage_ptr__->vertices[n_counter + 3] = (float)i * local_14;
      __return_storage_ptr__->vertices[n_counter + 4] =
           (float)(((uint)prVar10[i + (x + 1) * (long)heightmap.width].r +
                    (uint)prVar10[i + (x + 1) * (long)heightmap.width].g +
                   (uint)prVar10[i + (x + 1) * (long)heightmap.width].b) / 3) * fStack_10;
      __return_storage_ptr__->vertices[n_counter + 5] = (float)(x + 1) * fVar13;
      __return_storage_ptr__->vertices[n_counter + 6] = (float)(i + 1) * local_14;
      __return_storage_ptr__->vertices[n_counter + 7] =
           (float)(((uint)prVar10[i + 1 + x * heightmap.width].r +
                    (uint)prVar10[i + 1 + x * heightmap.width].g +
                   (uint)prVar10[i + 1 + x * heightmap.width].b) / 3) * fStack_10;
      __return_storage_ptr__->vertices[n_counter + 8] = (float)x * fVar13;
      __return_storage_ptr__->vertices[n_counter + 9] =
           __return_storage_ptr__->vertices[n_counter + 6];
      __return_storage_ptr__->vertices[n_counter + 10] =
           __return_storage_ptr__->vertices[n_counter + 7];
      __return_storage_ptr__->vertices[n_counter + 0xb] =
           __return_storage_ptr__->vertices[n_counter + 8];
      __return_storage_ptr__->vertices[n_counter + 0xc] =
           __return_storage_ptr__->vertices[n_counter + 3];
      __return_storage_ptr__->vertices[n_counter + 0xd] =
           __return_storage_ptr__->vertices[n_counter + 4];
      __return_storage_ptr__->vertices[n_counter + 0xe] =
           __return_storage_ptr__->vertices[n_counter + 5];
      __return_storage_ptr__->vertices[n_counter + 0xf] = (float)(i + 1) * local_14;
      __return_storage_ptr__->vertices[n_counter + 0x10] =
           (float)(((uint)prVar10[i + 1 + (x + 1) * (long)heightmap.width].r +
                    (uint)prVar10[i + 1 + (x + 1) * (long)heightmap.width].g +
                   (uint)prVar10[i + 1 + (x + 1) * (long)heightmap.width].b) / 3) * fStack_10;
      __return_storage_ptr__->vertices[n_counter + 0x11] = (float)(x + 1) * fVar13;
      n_counter = n_counter + 0x12;
      __return_storage_ptr__->texcoords[tris_counter] = (float)i / (float)(heightmap.width + -1);
      __return_storage_ptr__->texcoords[tris_counter + 1] =
           (float)x / (float)(heightmap.height + -1);
      __return_storage_ptr__->texcoords[tris_counter + 2] = (float)i / (float)(heightmap.width + -1)
      ;
      __return_storage_ptr__->texcoords[tris_counter + 3] =
           (float)(x + 1) / (float)(heightmap.height + -1);
      __return_storage_ptr__->texcoords[tris_counter + 4] =
           (float)(i + 1) / (float)(heightmap.width + -1);
      __return_storage_ptr__->texcoords[tris_counter + 5] =
           (float)x / (float)(heightmap.height + -1);
      __return_storage_ptr__->texcoords[tris_counter + 6] =
           __return_storage_ptr__->texcoords[tris_counter + 4];
      __return_storage_ptr__->texcoords[tris_counter + 7] =
           __return_storage_ptr__->texcoords[tris_counter + 5];
      __return_storage_ptr__->texcoords[tris_counter + 8] =
           __return_storage_ptr__->texcoords[tris_counter + 2];
      __return_storage_ptr__->texcoords[tris_counter + 9] =
           __return_storage_ptr__->texcoords[tris_counter + 3];
      __return_storage_ptr__->texcoords[tris_counter + 10] =
           (float)(i + 1) / (float)(heightmap.width + -1);
      __return_storage_ptr__->texcoords[tris_counter + 0xb] =
           (float)(x + 1) / (float)(heightmap.height + -1);
      tris_counter = tris_counter + 0xc;
      for (local_150 = 0; local_150 < 0x12; local_150 = local_150 + 3) {
        __return_storage_ptr__->normals[(int)scale_factor.z + local_150] = 0.0;
        __return_storage_ptr__->normals[(int)scale_factor.z + local_150 + 1] = 1.0;
        __return_storage_ptr__->normals[(int)scale_factor.z + local_150 + 2] = 0.0;
      }
      scale_factor.z = (float)((int)scale_factor.z + 0x12);
    }
  }
  (*(code *)temp_allocator_local.user_data)(&local_48);
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_heightmap(rf_image heightmap, rf_vec3 size, rf_allocator allocator, rf_allocator temp_allocator)
{
#define RF_GRAY_VALUE(c) ((c.r+c.g+c.b)/3)

    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    int map_x = heightmap.width;
    int map_z = heightmap.height;

    rf_color* pixels = rf_image_pixels_to_rgba32(heightmap, temp_allocator);

    // NOTE: One vertex per pixel
    mesh.triangle_count = (map_x - 1) * (map_z - 1) * 2; // One quad every four pixels

    mesh.vertex_count = mesh.triangle_count * 3;

    mesh.vertices  = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.normals   = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.texcoords = (float*) RF_ALLOC(allocator, mesh.vertex_count * 2 * sizeof(float));
    mesh.colors    = NULL;

    int vertex_pos_counter      = 0; // Used to count vertices float by float
    int vertex_texcoord_counter = 0; // Used to count texcoords float by float
    int n_counter               = 0; // Used to count normals float by float
    int tris_counter            = 0;

    rf_vec3 scale_factor = { size.x / map_x, size.y / 255.0f, size.z / map_z };

    for (rf_int z = 0; z < map_z-1; z++)
    {
        for (rf_int x = 0; x < map_x-1; x++)
        {
            // Fill vertices array with data
            //----------------------------------------------------------

            // one triangle - 3 vertex
            mesh.vertices[vertex_pos_counter    ] = (float) x * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 1] = (float) RF_GRAY_VALUE(pixels[x + z * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 2] = (float) z * scale_factor.z;

            mesh.vertices[vertex_pos_counter + 3] = (float) x * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 4] = (float) RF_GRAY_VALUE(pixels[x + (z + 1) * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 5] = (float) (z + 1) * scale_factor.z;

            mesh.vertices[vertex_pos_counter + 6] = (float)(x + 1) * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 7] = (float)RF_GRAY_VALUE(pixels[(x + 1) + z * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 8] = (float)z * scale_factor.z;

            // another triangle - 3 vertex
            mesh.vertices[vertex_pos_counter + 9 ] = mesh.vertices[vertex_pos_counter + 6];
            mesh.vertices[vertex_pos_counter + 10] = mesh.vertices[vertex_pos_counter + 7];
            mesh.vertices[vertex_pos_counter + 11] = mesh.vertices[vertex_pos_counter + 8];

            mesh.vertices[vertex_pos_counter + 12] = mesh.vertices[vertex_pos_counter + 3];
            mesh.vertices[vertex_pos_counter + 13] = mesh.vertices[vertex_pos_counter + 4];
            mesh.vertices[vertex_pos_counter + 14] = mesh.vertices[vertex_pos_counter + 5];

            mesh.vertices[vertex_pos_counter + 15] = (float)(x + 1) * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 16] = (float)RF_GRAY_VALUE(pixels[(x + 1) + (z + 1) * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 17] = (float)(z + 1) * scale_factor.z;
            vertex_pos_counter += 18; // 6 vertex, 18 floats

            // Fill texcoords array with data
            //--------------------------------------------------------------
            mesh.texcoords[vertex_texcoord_counter    ] = (float)x / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 1] = (float)z / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 2] = (float)x / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 3] = (float)(z + 1) / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 4] = (float)(x + 1) / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 5] = (float)z / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 6] = mesh.texcoords[vertex_texcoord_counter + 4];
            mesh.texcoords[vertex_texcoord_counter + 7] = mesh.texcoords[vertex_texcoord_counter + 5];

            mesh.texcoords[vertex_texcoord_counter + 8] = mesh.texcoords[vertex_texcoord_counter + 2];
            mesh.texcoords[vertex_texcoord_counter + 9] = mesh.texcoords[vertex_texcoord_counter + 3];

            mesh.texcoords[vertex_texcoord_counter + 10] = (float)(x + 1) / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 11] = (float)(z + 1) / (map_z - 1);

            vertex_texcoord_counter += 12; // 6 texcoords, 12 floats

            // Fill normals array with data
            //--------------------------------------------------------------
            for (rf_int i = 0; i < 18; i += 3)
            {
                mesh.normals[n_counter + i    ] = 0.0f;
                mesh.normals[n_counter + i + 1] = 1.0f;
                mesh.normals[n_counter + i + 2] = 0.0f;
            }

            // TODO: Calculate normals in an efficient way

            n_counter    += 18; // 6 vertex, 18 floats
            tris_counter += 2;
        }
    }

    RF_FREE(temp_allocator, pixels);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}